

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalFilterAndGroup.cpp
# Opt level: O2

bool __thiscall IntervalFilterAndGroup::accepts(IntervalFilterAndGroup *this,Interval *interval)

{
  pointer psVar1;
  element_type *peVar2;
  bool bVar3;
  int iVar4;
  pointer psVar5;
  
  bVar3 = IntervalFilter::is_done(&this->super_IntervalFilter);
  if (bVar3) {
LAB_0013ecc5:
    bVar3 = false;
  }
  else {
    psVar1 = (this->_filters).
             super__Vector_base<std::shared_ptr<IntervalFilter>,_std::allocator<std::shared_ptr<IntervalFilter>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar5 = (this->_filters).
                  super__Vector_base<std::shared_ptr<IntervalFilter>,_std::allocator<std::shared_ptr<IntervalFilter>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; psVar5 != psVar1; psVar5 = psVar5 + 1)
    {
      peVar2 = (psVar5->super___shared_ptr<IntervalFilter,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      iVar4 = (**peVar2->_vptr_IntervalFilter)(peVar2,interval);
      if ((char)iVar4 == '\0') {
        bVar3 = IntervalFilter::is_done
                          ((psVar5->super___shared_ptr<IntervalFilter,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr);
        if (bVar3) {
          IntervalFilter::set_done(&this->super_IntervalFilter,true);
        }
        goto LAB_0013ecc5;
      }
    }
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool IntervalFilterAndGroup::accepts (const Interval& interval)
{
  if (is_done ())
  {
    return false;
  }

  for (auto& filter: _filters)
  {
    if (filter->accepts (interval))
    {
      continue;
    }

    if (filter->is_done ())
    {
      set_done (true);
    }

    return false;
  }

  return true;
}